

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_flats.cpp
# Opt level: O3

void __thiscall GLFlat::DrawSkyboxSector(GLFlat *this,int pass,bool processlights)

{
  line_t *plVar1;
  FFlatVertexBuffer *pFVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  vertex_t *pvVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  FQuadDrawer qd;
  FQuadDrawer local_10;
  
  iVar5 = gl.buffermethod;
  pvVar9 = (vertex_t *)(ulong)(uint)pass;
  lVar6 = (long)this->sector->linecount;
  auVar16 = _DAT_0074d8d0;
  if (0 < lVar6) {
    lVar7 = 0;
    do {
      plVar1 = this->sector->lines[lVar7];
      pvVar9 = plVar1->v1;
      fVar17 = (float)(pvVar9->p).X;
      fVar18 = (float)(pvVar9->p).Y;
      pvVar9 = plVar1->v2;
      uVar12 = -(uint)(auVar16._0_4_ < fVar18);
      uVar13 = -(uint)(auVar16._4_4_ < fVar17);
      uVar14 = -(uint)(fVar18 < auVar16._8_4_);
      uVar15 = -(uint)(fVar17 < auVar16._12_4_);
      fVar19 = (float)(pvVar9->p).X;
      fVar20 = (float)(pvVar9->p).Y;
      fVar21 = (float)(~uVar12 & (uint)auVar16._0_4_ | (uint)fVar18 & uVar12);
      fVar22 = (float)(~uVar13 & (uint)auVar16._4_4_ | (uint)fVar17 & uVar13);
      fVar18 = (float)(~uVar14 & (uint)auVar16._8_4_ | (uint)fVar18 & uVar14);
      fVar17 = (float)(~uVar15 & (uint)auVar16._12_4_ | (uint)fVar17 & uVar15);
      uVar12 = -(uint)(fVar21 < fVar20);
      uVar13 = -(uint)(fVar22 < fVar19);
      uVar14 = -(uint)(fVar20 < fVar18);
      uVar15 = -(uint)(fVar19 < fVar17);
      auVar16._0_4_ = ~uVar12 & (uint)fVar21;
      auVar16._4_4_ = ~uVar13 & (uint)fVar22;
      auVar16._8_4_ = ~uVar14 & (uint)fVar18;
      auVar16._12_4_ = ~uVar15 & (uint)fVar17;
      auVar3._4_4_ = (uint)fVar19 & uVar13;
      auVar3._0_4_ = (uint)fVar20 & uVar12;
      auVar3._8_4_ = (uint)fVar20 & uVar14;
      auVar3._12_4_ = (uint)fVar19 & uVar15;
      auVar16 = auVar16 | auVar3;
      lVar7 = lVar7 + 1;
    } while (lVar6 != lVar7);
  }
  fVar17 = (float)((double)this->dz + (this->plane).plane.negiC * (this->plane).plane.D);
  iVar4 = SUB84((double)((this->plane).Angle * 0.011111111) + 6755399441055744.0,0);
  if (gl.buffermethod == 1) {
    local_10.p = FQuadDrawer::buffer;
    uVar12 = (uint)pvVar9;
  }
  else {
    pFVar2 = GLRenderer->mVBO;
    local_10.ndx = pFVar2->mCurIndex;
    pFVar2->mCurIndex = local_10.ndx + 4U;
    if (0x1e828b < local_10.ndx + 4U) {
      pFVar2->mCurIndex = pFVar2->mIndex;
    }
    local_10.p = pFVar2->map + (uint)local_10.ndx;
    uVar12 = local_10.ndx;
  }
  uVar8 = (ulong)((-iVar4 & 3U) << 2);
  fVar18 = *(float *)((long)DrawSkyboxSector::uvals + uVar8);
  fVar19 = *(float *)((long)DrawSkyboxSector::vvals + uVar8);
  uVar11 = (ulong)((1U - iVar4 & 3) << 2);
  uVar10 = (ulong)((2U - iVar4 & 3) << 2);
  uVar8 = (ulong)((3U - iVar4 & 3) << 2);
  (local_10.p)->x = auVar16._12_4_;
  (local_10.p)->z = fVar17;
  (local_10.p)->y = auVar16._8_4_;
  (local_10.p)->u = fVar18;
  (local_10.p)->v = fVar19;
  fVar18 = *(float *)((long)DrawSkyboxSector::uvals + uVar11);
  fVar19 = *(float *)((long)DrawSkyboxSector::vvals + uVar11);
  local_10.p[1].x = auVar16._12_4_;
  local_10.p[1].z = fVar17;
  local_10.p[1].y = auVar16._0_4_;
  local_10.p[1].u = fVar18;
  local_10.p[1].v = fVar19;
  fVar18 = *(float *)((long)DrawSkyboxSector::uvals + uVar10);
  fVar19 = *(float *)((long)DrawSkyboxSector::vvals + uVar10);
  local_10.p[2].x = auVar16._4_4_;
  local_10.p[2].z = fVar17;
  local_10.p[2].y = auVar16._0_4_;
  local_10.p[2].u = fVar18;
  local_10.p[2].v = fVar19;
  fVar18 = *(float *)((long)DrawSkyboxSector::uvals + uVar8);
  fVar19 = *(float *)((long)DrawSkyboxSector::vvals + uVar8);
  local_10.p[3].x = auVar16._4_4_;
  local_10.p[3].z = fVar17;
  local_10.p[3].y = auVar16._8_4_;
  local_10.p[3].u = fVar18;
  local_10.p[3].v = fVar19;
  if (iVar5 == 1) {
    FQuadDrawer::DoRender(&local_10,6);
  }
  else {
    (*_ptrc_glDrawArrays)(6,uVar12,4);
  }
  flatvertices = flatvertices + 4;
  flatprimitives = flatprimitives + 1;
  return;
}

Assistant:

void GLFlat::DrawSkyboxSector(int pass, bool processlights)
{

	float minx = FLT_MAX, miny = FLT_MAX;
	float maxx = -FLT_MAX, maxy = -FLT_MAX;

	for (int i = 0; i < sector->linecount; i++)
	{
		line_t *ln = sector->lines[i];
		float x = ln->v1->fX();
		float y = ln->v1->fY();
		if (x < minx) minx = x;
		if (y < miny) miny = y;
		if (x > maxx) maxx = x;
		if (y > maxy) maxy = y;
		x = ln->v2->fX();
		y = ln->v2->fY();
		if (x < minx) minx = x;
		if (y < miny) miny = y;
		if (x > maxx) maxx = x;
		if (y > maxy) maxy = y;
	}

	float z = plane.plane.ZatPoint(0., 0.) + dz;
	static float uvals[] = { 0, 0, 1, 1 };
	static float vvals[] = { 1, 0, 0, 1 };
	int rot = -xs_FloorToInt(plane.Angle / 90.f);

	FQuadDrawer qd;

	qd.Set(0, minx, z, miny, uvals[rot & 3], vvals[rot & 3]);
	qd.Set(1, minx, z, maxy, uvals[(rot + 1) & 3], vvals[(rot + 1) & 3]);
	qd.Set(2, maxx, z, maxy, uvals[(rot + 2) & 3], vvals[(rot + 2) & 3]);
	qd.Set(3, maxx, z, miny, uvals[(rot + 3) & 3], vvals[(rot + 3) & 3]);
	qd.Render(GL_TRIANGLE_FAN);

	flatvertices += 4;
	flatprimitives++;
}